

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSession.cpp
# Opt level: O0

void __thiscall tiger::trains::network::TCPSession::logout(TCPSession *this)

{
  size_t in_RCX;
  int __fd;
  TCPSession *in_RDI;
  int in_R8D;
  size_t len;
  uint32_t cmd;
  char sendBuffer [8];
  TCPClient *in_stack_ffffffffffffffb0;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 2;
  local_c = 0;
  __fd = (int)&local_10;
  send(in_RDI,__fd,(void *)0x8,in_RCX,in_R8D);
  TCPClient::close(&in_RDI->tcpClient,__fd);
  TCPClient::TCPClient(in_stack_ffffffffffffffb0);
  TCPClient::operator=(in_stack_ffffffffffffffb0,(TCPClient *)in_RDI);
  TCPClient::~TCPClient((TCPClient *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

void TCPSession::logout()
{
    char sendBuffer[8];
    uint32_t cmd = 2;
    size_t len = 0;

    memcpy(sendBuffer, &cmd, 4);
    memcpy(sendBuffer + 4, &len, 4);
    send(sendBuffer, len + 8);

    tcpClient.close();
    tcpClient = TCPClient();
}